

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void evaluate_motion_mode_for_winner_candidates
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_cost,HandleInterModeArgs *args,
               TileDataEnc *tile_data,PICK_MODE_CONTEXT *ctx,buf_2d (*yv12_mb) [3],
               motion_mode_best_st_candidate *best_motion_mode_cands,int do_tx_search,
               BLOCK_SIZE bsize,int64_t *best_est_rd,InterModeSearchState *search_state,int64_t *yrd
               )

{
  char cVar1;
  THR_MODES TVar2;
  int iVar3;
  int txfm_search_done;
  long lVar4;
  MACROBLOCK *x_00;
  long in_RCX;
  undefined8 *puVar5;
  long in_RSI;
  long in_RDI;
  long in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  RD_STATS *in_stack_00000028;
  long *in_stack_00000030;
  undefined8 *in_stack_00000038;
  THR_MODES mode_enum;
  int64_t ret_value;
  int64_t this_yrd;
  int64_t skip_rd [2];
  int i;
  int is_comp_pred;
  BUFFER_SET orig_dst;
  macroblockd_plane *pd;
  int rate_mv;
  RD_STATS rd_stats_uv;
  RD_STATS rd_stats_y;
  RD_STATS rd_stats;
  int cand;
  int num_best_cand;
  InterModesInfo *inter_modes_info;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int num_planes;
  AV1_COMMON *cm;
  RD_STATS *in_stack_00000b48;
  RD_STATS *in_stack_00000b50;
  BLOCK_SIZE in_stack_00000b5f;
  MACROBLOCK *in_stack_00000b60;
  TileDataEnc *in_stack_00000b68;
  AV1_COMP *in_stack_00000b70;
  RD_STATS *in_stack_00000b90;
  HandleInterModeArgs *in_stack_00000b98;
  int64_t in_stack_00000ba0;
  int64_t *in_stack_00000ba8;
  int *in_stack_00000bb0;
  BUFFER_SET *in_stack_00000bb8;
  int64_t *in_stack_00000bc0;
  int in_stack_00000bc8;
  InterModesInfo *in_stack_00000bd0;
  int in_stack_00000bd8;
  int64_t *in_stack_00000be0;
  uint8_t *in_stack_fffffffffffffe40;
  MACROBLOCKD *in_stack_fffffffffffffe48;
  AV1_COMMON *in_stack_fffffffffffffe50;
  RD_STATS *new_best_rd_stats_uv;
  int iVar6;
  undefined4 in_stack_fffffffffffffe64;
  RD_STATS *new_best_rd_stats;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffe74;
  RD_STATS *best_rd_stats_dst;
  InterModeSearchState *search_state_00;
  RD_STATS *rd_cost_uv;
  THR_MODES in_stack_fffffffffffffe90;
  undefined6 in_stack_fffffffffffffe91;
  MB_MODE_INFO *mbmi_00;
  MACROBLOCK *x_01;
  AV1_COMMON *cm_00;
  int local_148;
  THR_MODES mode_index;
  uint8_t *color_map;
  BLOCK_SIZE bsize_00;
  int iVar8;
  int multi_winner_mode_type;
  int local_10c;
  undefined1 local_108 [80];
  RD_STATS local_b8;
  uint32_t local_90;
  uint32_t local_8c;
  RD_STATS *local_88;
  void *local_80;
  long local_78;
  int16_t local_6c [2];
  AV1_COMMON *local_68;
  long local_50;
  long local_40;
  long local_38;
  
  local_68 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  local_50 = in_RCX;
  local_40 = in_RSI;
  local_38 = in_RDI;
  local_6c = (int16_t  [2])av1_num_planes(local_68);
  local_78 = local_40 + 0x1a0;
  local_80 = (void *)**(undefined8 **)(local_40 + 0x2058);
  local_88 = *(RD_STATS **)(local_40 + 0x1c640);
  local_8c = *(uint32_t *)(in_stack_00000010 + 2000);
  for (local_90 = 0; (int)local_90 < (int)local_8c; local_90 = local_90 + 1) {
    av1_init_rd_stats(&local_b8);
    av1_init_rd_stats((RD_STATS *)(local_108 + 0x28));
    av1_init_rd_stats((RD_STATS *)local_108);
    local_10c = *(int *)(in_stack_00000010 + (long)(int)local_90 * 200 + 0xb0);
    *(undefined4 *)(local_50 + 0x80) =
         *(undefined4 *)(in_stack_00000010 + (long)(int)local_90 * 200 + 0xb8);
    memcpy(local_80,(void *)(in_stack_00000010 + (long)(int)local_90 * 200),0xb0);
    local_b8.rate = *(uint32_t *)(in_stack_00000010 + (long)(int)local_90 * 200 + 0xb4);
    iVar3 = is_inter_singleref_mode(*(PREDICTION_MODE *)((long)local_80 + 2));
    if (iVar3 != 0) {
      *(undefined1 *)(local_40 + 0x24e08) = 0;
      txfm_search_done = (int)local_78 + 0x10;
      mode_index = (THR_MODES)*(undefined8 *)(local_78 + 0x20);
      color_map = *(uint8_t **)(local_78 + 0xa50);
      bsize_00 = (BLOCK_SIZE)*(undefined8 *)(local_78 + 0x1480);
      iVar3 = *(int *)(local_78 + 0x38);
      iVar8 = *(int *)(local_78 + 0xa68);
      multi_winner_mode_type = *(int *)(local_78 + 0x1498);
      set_ref_ptrs(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                   (MV_REFERENCE_FRAME)((ulong)in_stack_fffffffffffffe40 >> 0x38),
                   (MV_REFERENCE_FRAME)((ulong)in_stack_fffffffffffffe40 >> 0x30));
      *(undefined1 *)((long)local_80 + 0x18) = 0;
      cVar1 = *(char *)((long)local_80 + 0x11);
      for (local_148 = 0; local_148 < (int)local_6c; local_148 = local_148 + 1) {
        lVar4 = local_78 + 0x10 + (long)local_148 * 0xa30;
        puVar5 = (undefined8 *)
                 (in_stack_00000008 + (long)*(char *)((long)local_80 + 0x10) * 0x60 +
                 (long)local_148 * 0x20);
        *(undefined8 *)(lVar4 + 0x30) = *puVar5;
        *(undefined8 *)(lVar4 + 0x38) = puVar5[1];
        *(undefined8 *)(lVar4 + 0x40) = puVar5[2];
        *(undefined8 *)(lVar4 + 0x48) = puVar5[3];
        if ('\0' < cVar1) {
          lVar4 = local_78 + 0x10 + (long)local_148 * 0xa30;
          puVar5 = (undefined8 *)
                   (in_stack_00000008 + (long)*(char *)((long)local_80 + 0x11) * 0x60 +
                   (long)local_148 * 0x20);
          *(undefined8 *)(lVar4 + 0x50) = *puVar5;
          *(undefined8 *)(lVar4 + 0x58) = puVar5[1];
          *(undefined8 *)(lVar4 + 0x60) = puVar5[2];
          *(undefined8 *)(lVar4 + 0x68) = puVar5[3];
        }
      }
      x_01 = (MACROBLOCK *)in_stack_00000030[1];
      cm_00 = (AV1_COMMON *)in_stack_00000030[2];
      mbmi_00 = (MB_MODE_INFO *)0x7fffffffffffffff;
      in_stack_fffffffffffffe40 = &stack0xfffffffffffffea8;
      search_state_00 = (InterModeSearchState *)local_108;
      in_stack_fffffffffffffe48 = (MACROBLOCKD *)&stack0xfffffffffffffef4;
      in_stack_fffffffffffffe50 = (AV1_COMMON *)&stack0xfffffffffffffec0;
      best_rd_stats_dst = (RD_STATS *)&stack0xfffffffffffffea0;
      uVar7 = 1;
      new_best_rd_stats_uv = in_stack_00000028;
      iVar6 = in_stack_00000018;
      new_best_rd_stats = local_88;
      rd_cost_uv = best_rd_stats_dst;
      x_00 = (MACROBLOCK *)
             motion_mode_rd(in_stack_00000b70,in_stack_00000b68,in_stack_00000b60,in_stack_00000b5f,
                            in_stack_00000b50,in_stack_00000b48,in_stack_00000b90,in_stack_00000b98,
                            in_stack_00000ba0,in_stack_00000ba8,in_stack_00000bb0,in_stack_00000bb8,
                            in_stack_00000bc0,in_stack_00000bc8,in_stack_00000bd0,in_stack_00000bd8,
                            in_stack_00000be0);
      if (x_00 != (MACROBLOCK *)0x7fffffffffffffff) {
        local_b8.rdcost =
             ((long)local_b8.rate * (long)*(int *)(local_40 + 0x4218) + 0x100 >> 9) +
             local_b8.dist * 0x80;
        TVar2 = get_prediction_mode_idx
                          (*(PREDICTION_MODE *)((long)local_80 + 2),
                           *(MV_REFERENCE_FRAME *)((long)local_80 + 0x10),
                           *(MV_REFERENCE_FRAME *)((long)local_80 + 0x11));
        in_stack_fffffffffffffe48 =
             (MACROBLOCKD *)
             CONCAT44((int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                      (uint)*(byte *)(local_38 + 0x60c40));
        in_stack_fffffffffffffe50 =
             (AV1_COMMON *)
             CONCAT44((int)((ulong)in_stack_fffffffffffffe50 >> 0x20),in_stack_00000018);
        in_stack_fffffffffffffe40 = (uint8_t *)local_b8.rdcost;
        store_winner_mode_stats
                  (cm_00,x_01,mbmi_00,(RD_STATS *)x_00,
                   (RD_STATS *)
                   CONCAT17(TVar2,CONCAT61(in_stack_fffffffffffffe91,in_stack_fffffffffffffe90)),
                   rd_cost_uv,mode_index,color_map,bsize_00,CONCAT44(iVar8,iVar3),
                   multi_winner_mode_type,txfm_search_done);
        if (local_b8.rdcost < *in_stack_00000030) {
          *in_stack_00000038 = mbmi_00;
          update_search_state(search_state_00,best_rd_stats_dst,
                              (PICK_MODE_CONTEXT *)CONCAT44(in_stack_fffffffffffffe74,uVar7),
                              new_best_rd_stats,
                              (RD_STATS *)CONCAT44(in_stack_fffffffffffffe64,iVar6),
                              new_best_rd_stats_uv,in_stack_fffffffffffffe90,x_00,(int)mbmi_00);
          if (in_stack_00000018 != 0) {
            in_stack_00000030[1] = (long)x_01;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static inline void evaluate_motion_mode_for_winner_candidates(
    const AV1_COMP *const cpi, MACROBLOCK *const x, RD_STATS *const rd_cost,
    HandleInterModeArgs *const args, TileDataEnc *const tile_data,
    PICK_MODE_CONTEXT *const ctx,
    struct buf_2d yv12_mb[REF_FRAMES][MAX_MB_PLANE],
    const motion_mode_best_st_candidate *const best_motion_mode_cands,
    int do_tx_search, const BLOCK_SIZE bsize, int64_t *const best_est_rd,
    InterModeSearchState *const search_state, int64_t *yrd) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  InterModesInfo *const inter_modes_info = x->inter_modes_info;
  const int num_best_cand = best_motion_mode_cands->num_motion_mode_cand;

  for (int cand = 0; cand < num_best_cand; cand++) {
    RD_STATS rd_stats;
    RD_STATS rd_stats_y;
    RD_STATS rd_stats_uv;
    av1_init_rd_stats(&rd_stats);
    av1_init_rd_stats(&rd_stats_y);
    av1_init_rd_stats(&rd_stats_uv);
    int rate_mv;

    rate_mv = best_motion_mode_cands->motion_mode_cand[cand].rate_mv;
    args->skip_motion_mode =
        best_motion_mode_cands->motion_mode_cand[cand].skip_motion_mode;
    *mbmi = best_motion_mode_cands->motion_mode_cand[cand].mbmi;
    rd_stats.rate =
        best_motion_mode_cands->motion_mode_cand[cand].rate2_nocoeff;

    // Continue if the best candidate is compound.
    if (!is_inter_singleref_mode(mbmi->mode)) continue;

    x->txfm_search_info.skip_txfm = 0;
    struct macroblockd_plane *pd = xd->plane;
    const BUFFER_SET orig_dst = {
      { pd[0].dst.buf, pd[1].dst.buf, pd[2].dst.buf },
      { pd[0].dst.stride, pd[1].dst.stride, pd[2].dst.stride },
    };

    set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
    // Initialize motion mode to simple translation
    // Calculation of switchable rate depends on it.
    mbmi->motion_mode = 0;
    const int is_comp_pred = mbmi->ref_frame[1] > INTRA_FRAME;
    for (int i = 0; i < num_planes; i++) {
      xd->plane[i].pre[0] = yv12_mb[mbmi->ref_frame[0]][i];
      if (is_comp_pred) xd->plane[i].pre[1] = yv12_mb[mbmi->ref_frame[1]][i];
    }

    int64_t skip_rd[2] = { search_state->best_skip_rd[0],
                           search_state->best_skip_rd[1] };
    int64_t this_yrd = INT64_MAX;
    int64_t ret_value = motion_mode_rd(
        cpi, tile_data, x, bsize, &rd_stats, &rd_stats_y, &rd_stats_uv, args,
        search_state->best_rd, skip_rd, &rate_mv, &orig_dst, best_est_rd,
        do_tx_search, inter_modes_info, 1, &this_yrd);

    if (ret_value != INT64_MAX) {
      rd_stats.rdcost = RDCOST(x->rdmult, rd_stats.rate, rd_stats.dist);
      const THR_MODES mode_enum = get_prediction_mode_idx(
          mbmi->mode, mbmi->ref_frame[0], mbmi->ref_frame[1]);
      // Collect mode stats for multiwinner mode processing
      store_winner_mode_stats(
          &cpi->common, x, mbmi, &rd_stats, &rd_stats_y, &rd_stats_uv,
          mode_enum, NULL, bsize, rd_stats.rdcost,
          cpi->sf.winner_mode_sf.multi_winner_mode_type, do_tx_search);
      if (rd_stats.rdcost < search_state->best_rd) {
        *yrd = this_yrd;
        update_search_state(search_state, rd_cost, ctx, &rd_stats, &rd_stats_y,
                            &rd_stats_uv, mode_enum, x, do_tx_search);
        if (do_tx_search) search_state->best_skip_rd[0] = skip_rd[0];
      }
    }
  }
}